

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::OP_NewScopeObjectWithFormals
              (ScriptContext *scriptContext,FunctionBody *calleeBody,bool nonSimpleParamList)

{
  bool bVar1;
  ThreadContext *pTVar2;
  DynamicTypeHandler *newTypeHandler;
  DynamicObject *this;
  PropertyIdArray *pPVar3;
  DynamicType *pDVar4;
  PropertyAttributes extraAttributes;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  this = (DynamicObject *)OP_NewScopeObject(scriptContext);
  if (nonSimpleParamList) {
    pDVar4 = (DynamicType *)(this->super_RecyclableObject).type.ptr;
    if ((calleeBody->field_0x17b & 2) != 0) {
      pPVar3 = FunctionBody::GetFormalsPropIdArray(calleeBody,true);
      pDVar4 = PathTypeHandlerBase::CreateNewScopeObject<true>
                         (scriptContext,pDVar4,pPVar3,'G',0xffffffff);
      goto LAB_009a5ed9;
    }
    pPVar3 = FunctionBody::GetFormalsPropIdArray(calleeBody,true);
    extraAttributes = 'G';
  }
  else {
    pDVar4 = (DynamicType *)(this->super_RecyclableObject).type.ptr;
    pPVar3 = FunctionBody::GetFormalsPropIdArray(calleeBody,true);
    extraAttributes = '\0';
  }
  pDVar4 = PathTypeHandlerBase::CreateNewScopeObject<false>
                     (scriptContext,pDVar4,pPVar3,extraAttributes,0xffffffff);
LAB_009a5ed9:
  newTypeHandler = (pDVar4->typeHandler).ptr;
  DynamicObject::EnsureSlots
            (this,*(int *)(*(long *)((this->super_RecyclableObject).type.ptr + 1) + 0xc),
             newTypeHandler->slotCapacity,scriptContext,newTypeHandler);
  DynamicObject::ReplaceType(this,pDVar4);
  pTVar2->noJsReentrancy = bVar1;
  return this;
}

Assistant:

Var JavascriptOperators::OP_NewScopeObjectWithFormals(ScriptContext* scriptContext, FunctionBody * calleeBody, bool nonSimpleParamList)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(OP_NewScopeObjectWithFormals, reentrancylock, scriptContext->GetThreadContext());
        Js::ActivationObject * frameObject = (ActivationObject*)OP_NewScopeObject(scriptContext);
        // No fixed fields for formal parameters of the arguments object.  Also, mark all fields as initialized up-front, because
        // we will set them directly using SetSlot below, so the type handler will not have a chance to mark them as initialized later.
        // CONSIDER : When we delay type sharing until the second instance is created, pass an argument indicating we want the types
        // and handlers created here to be marked as shared up-front. This is to ensure we don't get any fixed fields and that the handler
        // is ready for storing values directly to slots.
        DynamicType* newType = nullptr;
        if (nonSimpleParamList)
        {
            if (calleeBody->HasReferenceableBuiltInArguments())
            {
                newType = PathTypeHandlerBase::CreateNewScopeObject<true>(scriptContext, frameObject->GetDynamicType(), calleeBody->GetFormalsPropIdArray(), PropertyLetDefaults);
            }
            else
            {
                newType = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, frameObject->GetDynamicType(), calleeBody->GetFormalsPropIdArray(), PropertyLetDefaults);
            }
        }
        else
        {
            newType = PathTypeHandlerBase::CreateNewScopeObject<false>(scriptContext, frameObject->GetDynamicType(), calleeBody->GetFormalsPropIdArray());
        }

        int oldSlotCapacity = frameObject->GetDynamicType()->GetTypeHandler()->GetSlotCapacity();
        int newSlotCapacity = newType->GetTypeHandler()->GetSlotCapacity();

        frameObject->EnsureSlots(oldSlotCapacity, newSlotCapacity, scriptContext, newType->GetTypeHandler());
        frameObject->ReplaceType(newType);

        return frameObject;
        JIT_HELPER_END(OP_NewScopeObjectWithFormals);
    }